

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmApi.c
# Opt level: O2

Vec_Int_t * Nm_ManReturnNameIds(Nm_Man_t *p)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int *__ptr;
  long lVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  
  uVar4 = p->nEntries;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  if (uVar4 - 1 < 0xf) {
    uVar4 = 0x10;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = uVar4;
  uVar7 = 0;
  if (uVar4 == 0) {
    __ptr = (int *)0x0;
  }
  else {
    __ptr = (int *)malloc((long)(int)uVar4 << 2);
  }
  pVVar2->pArray = __ptr;
  lVar5 = 0;
  do {
    if (p->nBins <= lVar5) {
      return pVVar2;
    }
    if (p->pBinsI2N[lVar5] != (Nm_Entry_t *)0x0) {
      uVar1 = p->pBinsI2N[lVar5]->ObjId;
      if (uVar7 == uVar4) {
        uVar6 = uVar4 * 2;
        if ((int)uVar4 < 0x10) {
          uVar6 = 0x10;
        }
        if ((int)uVar4 < (int)uVar6) {
          if (__ptr == (int *)0x0) {
            __ptr = (int *)malloc((ulong)uVar6 << 2);
          }
          else {
            __ptr = (int *)realloc(__ptr,(ulong)uVar6 << 2);
          }
          pVVar2->pArray = __ptr;
          if (__ptr == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar2->nCap = uVar6;
          uVar4 = uVar6;
        }
      }
      lVar3 = (long)(int)uVar7;
      uVar7 = uVar7 + 1;
      pVVar2->nSize = uVar7;
      __ptr[lVar3] = uVar1;
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Nm_ManReturnNameIds( Nm_Man_t * p )
{
    Vec_Int_t * vNameIds;
    int i;
    vNameIds = Vec_IntAlloc( p->nEntries );
    for ( i = 0; i < p->nBins; i++ )
        if ( p->pBinsI2N[i] )
            Vec_IntPush( vNameIds, p->pBinsI2N[i]->ObjId );
    return vNameIds;
}